

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_simulation.cpp
# Opt level: O0

void TestObservationSampling(DecPOMDPDiscrete *decpomdp)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  reference pvVar7;
  long *in_RDI;
  double dVar8;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined1 auVar9 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  int k_2;
  int k_1;
  int i;
  int k;
  int j;
  int nrRuns;
  Index ja;
  Index si;
  Index jo;
  Index jointActions [10];
  Index states [10];
  vector<unsigned_int,_std::allocator<unsigned_int>_> count;
  int nrJO;
  Index s_ip;
  Index ja_i;
  Index jo_i;
  allocator_type *in_stack_fffffffffffffed8;
  ostream *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffef0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  uint local_a8 [12];
  uint local_78 [5];
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_34;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  int local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  long *local_8;
  undefined1 auVar10 [64];
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"jo\tja\ts\'\tP");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_c = 0;
  while( true ) {
    uVar5 = (ulong)local_c;
    uVar6 = (**(code **)(*local_8 + 0xd0))();
    if (uVar6 <= uVar5) break;
    local_10 = 0;
    while( true ) {
      uVar5 = (ulong)local_10;
      uVar6 = (**(code **)(*local_8 + 0x70))();
      if (uVar6 <= uVar5) break;
      local_14 = 0;
      while( true ) {
        uVar5 = (ulong)local_14;
        uVar6 = (**(code **)(*local_8 + 0x30))();
        if (uVar6 <= uVar5) break;
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_c);
        poVar4 = std::operator<<(poVar4,"\t");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
        poVar4 = std::operator<<(poVar4,"\t");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
        poVar4 = std::operator<<(poVar4,"\t");
        dVar8 = (double)(**(code **)(*local_8 + 0x128))(local_8,local_10,local_14,local_c);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        local_14 = local_14 + 1;
      }
      local_10 = local_10 + 1;
    }
    local_c = local_c + 1;
  }
  local_18 = (**(code **)(*local_8 + 0xd0))();
  local_34 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x10a913);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (value_type_conflict3 *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x10a941);
  memset(local_78,0,0x28);
  local_64 = 1;
  local_60 = 1;
  local_5c = 1;
  local_58 = 1;
  local_54 = 1;
  memcpy(local_a8,&DAT_00110490,0x28);
  for (local_bc = 0; local_bc < 10; local_bc = local_bc + 1) {
    uVar1 = local_78[local_bc];
    uVar2 = local_a8[local_bc];
    for (local_c0 = 0; local_c0 < local_18; local_c0 = local_c0 + 1) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_30,(long)local_c0);
      *pvVar7 = 0;
    }
    for (local_c4 = 0; local_c4 < 100000; local_c4 = local_c4 + 1) {
      uVar3 = (**(code **)(*local_8 + 0x140))(local_8,uVar2,uVar1);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_30,(ulong)uVar3);
      *pvVar7 = *pvVar7 + 1;
    }
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar2);
    poVar4 = std::operator<<(poVar4,"\t");
    in_stack_fffffffffffffee0 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
    auVar10._8_56_ = extraout_var;
    auVar10._0_8_ = extraout_XMM0_Qa;
    std::operator<<(in_stack_fffffffffffffee0,"\t");
    for (local_c8 = 0; local_c8 < local_18; local_c8 = local_c8 + 1) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_30,(long)local_c8);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar7);
      auVar10._8_56_ = extraout_var_00;
      auVar10._0_8_ = extraout_XMM0_Qa_00;
      std::operator<<(poVar4,"\t");
    }
    std::operator<<((ostream *)&std::cout," prob ");
    for (local_cc = 0; auVar9 = auVar10._0_16_, local_cc < local_18; local_cc = local_cc + 1) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_30,(long)local_cc);
      auVar9 = vcvtusi2sd_avx512f(auVar9,*pvVar7);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,auVar9._0_8_ / 100000.0);
      auVar10._8_56_ = extraout_var_01;
      auVar10._0_8_ = extraout_XMM0_Qa_01;
      std::operator<<(poVar4,"\t");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffee0);
  return;
}

Assistant:

void TestObservationSampling(DecPOMDPDiscrete *decpomdp)
{
    cout << "jo\tja\ts'\tP"<<endl;
    for(Index jo_i = 0; jo_i < decpomdp->GetNrJointObservations(); jo_i++)
        for(Index ja_i = 0; ja_i < decpomdp->GetNrJointActions(); ja_i++)
            for(Index s_ip = 0; s_ip < decpomdp->GetNrStates(); s_ip++)
                cout << jo_i << "\t" << ja_i << "\t" << s_ip << "\t" <<
                    decpomdp->GetObservationProbability(ja_i, s_ip, jo_i) << endl;
  
    int nrJO=decpomdp->GetNrJointObservations();
    vector<Index> count(nrJO,0);
    Index states[10]={0,0,0,0,0,1,1,1,1,1};
    Index jointActions[10]={0,1,2,3,4,6,4,1,2,4};
    Index jo,si,ja;
    int nrRuns=NRRUNS;

    for(int j=0;j<10;j++)
    {
        si=states[j];
        ja=jointActions[j];
        for(int k=0;k<nrJO;k++)
            count[k]=0;

        for(int i=0;i<nrRuns;i++)
        {
            jo=decpomdp->SampleJointObservation(ja,si);
            count[jo]++;
        }
        cout << ja << "\t" << si << "\t";
        for(int k=0;k<nrJO;k++)
            cout << count[k] << "\t";
        cout << " prob ";
        for(int k=0;k<nrJO;k++)
            cout << ((double)count[k]/nrRuns) << "\t";
        cout << endl;
    }

}